

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int fits_rebin_wcs(fitsfile *fptr,int naxis,float *amin,float *binsize,int *status)

{
  int local_80;
  int local_7c;
  int naxis1;
  int i;
  double binsized [4];
  double amind [4];
  int *status_local;
  float *binsize_local;
  float *amin_local;
  int naxis_local;
  fitsfile *fptr_local;
  
  if (*status == 0) {
    local_80 = 4;
    if (naxis < 4) {
      local_80 = naxis;
    }
    for (local_7c = 0; local_7c < local_80; local_7c = local_7c + 1) {
      binsized[(long)local_7c + 3] = (double)amin[local_7c];
      *(double *)(&naxis1 + (long)local_7c * 2) = (double)binsize[local_7c];
    }
    fits_rebin_wcsd(fptr,naxis,binsized + 3,(double *)&naxis1,status);
  }
  return *status;
}

Assistant:

int fits_rebin_wcs(
      fitsfile *fptr,   /* I - pointer to table to be binned           */
      int naxis,        /* I - number of axes in the histogram image   */
      float *amin,     /* I - first pixel include in each axis        */
      float *binsize,  /* I - binning factor for each axis            */
      int *status)      
{
  double amind[4], binsized[4];

  /* Copy single precision values into double precision */
  if (*status == 0) {
    int i, naxis1 = 4;
    if (naxis < naxis1) naxis1 = naxis;
    for (i=0; i<naxis1; i++) {
      amind[i] = (double) amin[i];
      binsized[i] = (double) binsize[i];
    }

    fits_rebin_wcsd(fptr, naxis, amind, binsized, status);
  }


  return (*status);
}